

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_SetPrint(FILE *pFile,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  char *__s;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  
  __s = (char *)malloc((long)(nRegs + 1));
  uVar2 = 0;
  uVar3 = (ulong)(uint)nRegs;
  if (nRegs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    __s[uVar2] = '-';
  }
  __s[uVar3] = '\0';
  uVar2 = 0;
  uVar3 = (ulong)(uint)p->nLits;
  if (p->nLits < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar4 = *(int *)(&p->field_0x14 + uVar2 * 4);
    if (iVar4 != -1) {
      __s[iVar4 >> 1] = (byte)iVar4 & 1 ^ 0x31;
    }
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    iVar4 = 0;
    for (lVar5 = 0; lVar5 < vFlopCounts->nSize; lVar5 = lVar5 + 1) {
      iVar1 = Vec_IntEntry(vFlopCounts,(int)lVar5);
      if (iVar1 != 0) {
        __s[iVar4] = __s[lVar5];
        iVar4 = iVar4 + 1;
      }
    }
    __s[iVar4] = '\0';
  }
  fputs(__s,(FILE *)pFile);
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrint( FILE * pFile, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[lit_var(p->Lits[i])] = (lit_sign(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        k = 0;
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    fprintf( pFile, "%s", pBuff );
    ABC_FREE( pBuff );
}